

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileselector.cpp
# Opt level: O2

int __thiscall
QFileSelectorPrivate::select
          (QFileSelectorPrivate *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  QFileSelector *this_00;
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  longlong __old_val;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QFileInfo fi;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileSelector **)(CONCAT44(in_register_00000034,__nfds) + 8);
  fi.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo(&fi,(QString *)__readfds);
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::path((QString *)&local_88,&fi);
  if ((undefined1 *)local_88.size != (undefined1 *)0x0) {
    bVar4 = QString::endsWith((QString *)&local_88,(QChar)0x2f,CaseSensitive);
    if (bVar4) {
      local_a8.d = local_88.d;
      local_a8.ptr = local_88.ptr;
      local_a8.size = local_88.size;
      if (local_88.d != (Data *)0x0) {
        LOCK();
        ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_48.ptr._0_2_ = 0x2f;
      local_48.d = (Data *)&local_88;
      QStringBuilder<QString_&,_char16_t>::convertTo<QString>
                ((QString *)&local_a8,(QStringBuilder<QString_&,_char16_t> *)&local_48);
    }
    qVar3 = local_68.size;
    pcVar2 = local_68.ptr;
    pDVar1 = local_68.d;
    local_68.d = local_a8.d;
    local_68.ptr = local_a8.ptr;
    local_a8.d = pDVar1;
    local_a8.ptr = pcVar2;
    local_68.size = local_a8.size;
    local_a8.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::fileName((QString *)&local_a8,&fi);
  QFileSelector::allSelectors((QStringList *)&local_48,this_00);
  selectionHelper((QString *)&local_88,(QString *)&local_68,(QString *)&local_a8,
                  (QStringList *)&local_48,(QChar)0x2b);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  qVar3 = local_88.size;
  pcVar2 = local_88.ptr;
  pDVar1 = local_88.d;
  if ((QObject *)local_88.size == (QObject *)0x0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)this,(QArrayDataPointer<char16_t> *)__readfds);
  }
  else {
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    (this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData = (_func_int **)pDVar1;
    (this->super_QObjectPrivate).super_QObjectData.q_ptr = (QObject *)pcVar2;
    local_88.size = 0;
    (this->super_QObjectPrivate).super_QObjectData.parent = (QObject *)qVar3;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QFileInfo::~QFileInfo(&fi);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSelectorPrivate::select(const QString &filePath) const
{
    Q_Q(const QFileSelector);
    QFileInfo fi(filePath);

    QString pathString;
    if (auto path = fi.path(); !path.isEmpty())
        pathString = path.endsWith(u'/') ? path : path + u'/';
    QString ret = selectionHelper(pathString,
            fi.fileName(), q->allSelectors());

    if (!ret.isEmpty())
        return ret;
    return filePath;
}